

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O3

void (anonymous_namespace)::test<ddd::DictionaryMLT<true,true>>
               (vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *kvs,
               unique_ptr<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
               *dic)

{
  pointer pKVar1;
  DictionaryMLT<false,_false> *pDVar2;
  iterator __position;
  undefined8 *puVar3;
  long lVar4;
  int iVar5;
  uint32_t uVar6;
  pointer pKVar7;
  DictionaryMLT<false,_false> *pDVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long *plVar12;
  long *plVar13;
  long *plVar14;
  long *plVar15;
  vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> test_kvs [2];
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> ret;
  long *local_2c8;
  long alStack_2c0 [2];
  long *plStack_2b0;
  long *local_2a8;
  undefined8 uStack_2a0;
  undefined1 local_298 [8];
  pointer pKStack_290;
  pointer local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  ios_base local_1a0 [280];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long lStack_40;
  
  pKVar7 = (kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pKVar1 = (kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pKVar7 != pKVar1) {
    do {
      pDVar2 = (dic->_M_t).
               super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
               .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
      iVar5 = (*(pDVar2->super_Dictionary)._vptr_Dictionary[4])
                        (pDVar2,(pKVar7->key)._M_dataplus._M_p,(ulong)pKVar7->value);
      if ((char)iVar5 == '\0') {
        __assert_fail("dic->insert_key(kv.key.c_str(), kv.value)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                      ,0x3a,
                      "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionaryMLT<true, true>]"
                     );
      }
      pKVar7 = pKVar7 + 1;
    } while (pKVar7 != pKVar1);
    pKVar1 = (kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pKVar7 = (kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
                  super__Vector_impl_data._M_start; pKVar7 != pKVar1; pKVar7 = pKVar7 + 1) {
      pDVar2 = (dic->_M_t).
               super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
               .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
      uVar6 = (*(pDVar2->super_Dictionary)._vptr_Dictionary[3])
                        (pDVar2,(pKVar7->key)._M_dataplus._M_p);
      if (uVar6 != pKVar7->value) {
        __assert_fail("dic->search_key(kv.key.c_str()) == kv.value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                      ,0x3d,
                      "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionaryMLT<true, true>]"
                     );
      }
    }
  }
  local_258 = 0;
  uStack_250 = 0;
  local_268 = 0;
  uStack_260 = 0;
  local_278 = 0;
  uStack_270 = 0;
  local_288 = (pointer)0x0;
  uStack_280 = 0;
  local_298 = (undefined1  [8])0x0;
  pKStack_290 = (pointer)0x0;
  pDVar2 = (dic->_M_t).
           super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
           .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
  (*(pDVar2->super_Dictionary)._vptr_Dictionary[10])(pDVar2,local_298);
  if (local_298 ==
      (undefined1  [8])
      (((long)(kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3) * -0x3333333333333333)) {
    local_298 = (undefined1  [8])0x0;
    pKStack_290 = (pointer)0x0;
    local_288 = (pointer)0x0;
    (*(((dic->_M_t).
        super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
        .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl)->
      super_Dictionary)._vptr_Dictionary[6])();
    if ((long)(kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
              super__Vector_impl_data._M_start != (long)pKStack_290 - (long)local_298) {
      __assert_fail("kvs.size() == ret.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                    ,0x47,
                    "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionaryMLT<true, true>]"
                   );
    }
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::~vector
              ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)local_298);
    local_2a8 = (long *)0x0;
    uStack_2a0 = 0;
    alStack_2c0[1] = 0;
    plStack_2b0 = (long *)0x0;
    local_2c8 = (long *)0x0;
    alStack_2c0[0] = 0;
    pKVar7 = (kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
             super__Vector_impl_data._M_start;
    plVar12 = local_2c8;
    plVar14 = (long *)alStack_2c0[0];
    if ((kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
        super__Vector_impl_data._M_finish != pKVar7) {
      lVar11 = 0;
      uVar10 = 0;
      do {
        uVar9 = (ulong)((uint)uVar10 & 1);
        local_298 = (undefined1  [8])((long)&(pKVar7->key)._M_dataplus._M_p + lVar11);
        __position._M_current = (KvPair **)alStack_2c0[uVar9 * 3];
        if (__position._M_current == (KvPair **)alStack_2c0[uVar9 * 3 + 1]) {
          std::vector<ddd::KvPair_const*,std::allocator<ddd::KvPair_const*>>::
          _M_realloc_insert<ddd::KvPair_const*>
                    ((vector<ddd::KvPair_const*,std::allocator<ddd::KvPair_const*>> *)
                     (&local_2c8 + uVar9 * 3),__position,(KvPair **)local_298);
        }
        else {
          *__position._M_current = (KvPair *)local_298;
          alStack_2c0[uVar9 * 3] = alStack_2c0[uVar9 * 3] + 8;
        }
        lVar4 = alStack_2c0[0];
        uVar10 = uVar10 + 1;
        pKVar7 = (kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 0x28;
        plVar15 = local_2c8;
      } while (uVar10 < (ulong)(((long)(kvs->
                                       super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pKVar7 >>
                                3) * -0x3333333333333333));
      for (; plVar12 = local_2c8, plVar14 = (long *)alStack_2c0[0], plVar15 != (long *)lVar4;
          plVar15 = plVar15 + 1) {
        puVar3 = (undefined8 *)*plVar15;
        pDVar2 = (dic->_M_t).
                 super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                 .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
        iVar5 = (*(pDVar2->super_Dictionary)._vptr_Dictionary[5])(pDVar2,*puVar3);
        if (iVar5 != *(int *)(puVar3 + 4)) {
          __assert_fail("dic->delete_key(kv->key.c_str()) == kv->value",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                        ,0x50,
                        "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionaryMLT<true, true>]"
                       );
        }
      }
    }
    while( true ) {
      plVar15 = local_2a8;
      plVar13 = plStack_2b0;
      if (plVar12 == plVar14) {
        while( true ) {
          if (plVar13 == plVar15) {
            std::ofstream::ofstream(local_298,"test.index",_S_out);
            pDVar2 = (dic->_M_t).
                     super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                     .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
            (*(pDVar2->super_Dictionary)._vptr_Dictionary[0xc])(pDVar2,local_298);
            local_298 = (undefined1  [8])_VTT;
            *(undefined8 *)(local_298 + _VTT[-1].key.field_2._M_allocated_capacity) = __filebuf;
            std::filebuf::~filebuf((filebuf *)&pKStack_290);
            std::ios_base::~ios_base(local_1a0);
            std::ifstream::ifstream(local_298,"test.index",_S_in);
            std::istream::seekg((long)local_298,_S_beg);
            lVar11 = std::istream::tellg();
            local_48 = 0;
            lStack_40 = 0;
            local_58 = 0;
            uStack_50 = 0;
            local_68 = 0;
            uStack_60 = 0;
            local_78 = 0;
            uStack_70 = 0;
            local_88 = 0;
            uStack_80 = 0;
            (*(((dic->_M_t).
                super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl)->
              super_Dictionary)._vptr_Dictionary[10])();
            if (lStack_40 != lVar11) {
              __assert_fail("stat.size_in_bytes == size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                            ,100,
                            "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionaryMLT<true, true>]"
                           );
            }
            std::ifstream::~ifstream(local_298);
            std::ifstream::ifstream(local_298,"test.index",_S_in);
            pDVar8 = (DictionaryMLT<false,_false> *)operator_new(0x38);
            ddd::DictionaryMLT<true,_true>::DictionaryMLT
                      ((DictionaryMLT<true,_true> *)pDVar8,(istream *)local_298);
            pDVar2 = (dic->_M_t).
                     super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                     .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
            (dic->_M_t).
            super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
            .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl = pDVar8;
            if (pDVar2 != (DictionaryMLT<false,_false> *)0x0) {
              (*(pDVar2->super_Dictionary)._vptr_Dictionary[1])();
            }
            std::ifstream::~ifstream(local_298);
            (*(((dic->_M_t).
                super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl)->
              super_Dictionary)._vptr_Dictionary[7])();
            lVar11 = alStack_2c0[0];
            plVar14 = local_2c8;
            while( true ) {
              plVar12 = local_2a8;
              plVar15 = plStack_2b0;
              if (plVar14 == (long *)lVar11) {
                while( true ) {
                  if (plVar15 == plVar12) {
                    local_258 = 0;
                    uStack_250 = 0;
                    local_268 = 0;
                    uStack_260 = 0;
                    local_278 = 0;
                    uStack_270 = 0;
                    local_288 = (pointer)0x0;
                    uStack_280 = 0;
                    local_298 = (undefined1  [8])0x0;
                    pKStack_290 = (pointer)0x0;
                    (*(((dic->_M_t).
                        super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                        .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl
                       )->super_Dictionary)._vptr_Dictionary[10])();
                    if (local_298 != (undefined1  [8])((long)local_2a8 - (long)plStack_2b0 >> 3)) {
                      __assert_fail("stat.num_keys == test_kvs[1].size()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                                    ,0x77,
                                    "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionaryMLT<true, true>]"
                                   );
                    }
                    std::ifstream::ifstream(local_298,"test.index",_S_in);
                    pDVar8 = (DictionaryMLT<false,_false> *)operator_new(0x38);
                    ddd::DictionaryMLT<true,_true>::DictionaryMLT
                              ((DictionaryMLT<true,_true> *)pDVar8,(istream *)local_298);
                    pDVar2 = (dic->_M_t).
                             super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                             .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>.
                             _M_head_impl;
                    (dic->_M_t).
                    super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                    .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl =
                         pDVar8;
                    if (pDVar2 != (DictionaryMLT<false,_false> *)0x0) {
                      (*(pDVar2->super_Dictionary)._vptr_Dictionary[1])();
                    }
                    std::ifstream::~ifstream(local_298);
                    (*(((dic->_M_t).
                        super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                        .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl
                       )->super_Dictionary)._vptr_Dictionary[8])();
                    lVar11 = alStack_2c0[0];
                    plVar14 = local_2c8;
                    while( true ) {
                      plVar12 = local_2a8;
                      plVar15 = plStack_2b0;
                      if (plVar14 == (long *)lVar11) {
                        while( true ) {
                          if (plVar15 == plVar12) {
                            local_258 = 0;
                            uStack_250 = 0;
                            local_268 = 0;
                            uStack_260 = 0;
                            local_278 = 0;
                            uStack_270 = 0;
                            local_288 = (pointer)0x0;
                            uStack_280 = 0;
                            local_298 = (undefined1  [8])0x0;
                            pKStack_290 = (pointer)0x0;
                            (*(((dic->_M_t).
                                super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                                .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>.
                               _M_head_impl)->super_Dictionary)._vptr_Dictionary[10])();
                            if (local_298 !=
                                (undefined1  [8])((long)local_2a8 - (long)plStack_2b0 >> 3)) {
                              __assert_fail("stat.num_keys == test_kvs[1].size()",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                                            ,0x8a,
                                            "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionaryMLT<true, true>]"
                                           );
                            }
                            lVar11 = 0x18;
                            do {
                              if (*(void **)((long)&local_2c8 + lVar11) != (void *)0x0) {
                                operator_delete(*(void **)((long)&local_2c8 + lVar11));
                              }
                              lVar11 = lVar11 + -0x18;
                            } while (lVar11 != -0x18);
                            return;
                          }
                          puVar3 = (undefined8 *)*plVar15;
                          pDVar2 = (dic->_M_t).
                                   super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                                   .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>.
                                   _M_head_impl;
                          iVar5 = (*(pDVar2->super_Dictionary)._vptr_Dictionary[3])(pDVar2,*puVar3);
                          if (iVar5 != *(int *)(puVar3 + 4)) break;
                          plVar15 = plVar15 + 1;
                        }
                        __assert_fail("dic->search_key(kv->key.c_str()) == kv->value",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                                      ,0x85,
                                      "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionaryMLT<true, true>]"
                                     );
                      }
                      pDVar2 = (dic->_M_t).
                               super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                               .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>.
                               _M_head_impl;
                      iVar5 = (*(pDVar2->super_Dictionary)._vptr_Dictionary[3])
                                        (pDVar2,*(undefined8 *)*plVar14);
                      if (iVar5 != -1) break;
                      plVar14 = plVar14 + 1;
                    }
                    __assert_fail("dic->search_key(kv->key.c_str()) == NOT_FOUND",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                                  ,0x82,
                                  "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionaryMLT<true, true>]"
                                 );
                  }
                  puVar3 = (undefined8 *)*plVar15;
                  pDVar2 = (dic->_M_t).
                           super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                           .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>.
                           _M_head_impl;
                  iVar5 = (*(pDVar2->super_Dictionary)._vptr_Dictionary[3])(pDVar2,*puVar3);
                  if (iVar5 != *(int *)(puVar3 + 4)) break;
                  plVar15 = plVar15 + 1;
                }
                __assert_fail("dic->search_key(kv->key.c_str()) == kv->value",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                              ,0x72,
                              "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionaryMLT<true, true>]"
                             );
              }
              pDVar2 = (dic->_M_t).
                       super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                       .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
              iVar5 = (*(pDVar2->super_Dictionary)._vptr_Dictionary[3])
                                (pDVar2,*(undefined8 *)*plVar14);
              if (iVar5 != -1) break;
              plVar14 = plVar14 + 1;
            }
            __assert_fail("dic->search_key(kv->key.c_str()) == NOT_FOUND",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                          ,0x6f,
                          "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionaryMLT<true, true>]"
                         );
          }
          puVar3 = (undefined8 *)*plVar13;
          pDVar2 = (dic->_M_t).
                   super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                   .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
          iVar5 = (*(pDVar2->super_Dictionary)._vptr_Dictionary[3])(pDVar2,*puVar3);
          if (iVar5 != *(int *)(puVar3 + 4)) break;
          plVar13 = plVar13 + 1;
        }
        __assert_fail("dic->search_key(kv->key.c_str()) == kv->value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                      ,0x56,
                      "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionaryMLT<true, true>]"
                     );
      }
      pDVar2 = (dic->_M_t).
               super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
               .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
      iVar5 = (*(pDVar2->super_Dictionary)._vptr_Dictionary[3])(pDVar2,*(undefined8 *)*plVar12);
      if (iVar5 != -1) break;
      plVar12 = plVar12 + 1;
    }
    __assert_fail("dic->search_key(kv->key.c_str()) == NOT_FOUND",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                  ,0x53,
                  "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionaryMLT<true, true>]"
                 );
  }
  __assert_fail("stat.num_keys == kvs.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp",
                0x42,
                "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionaryMLT<true, true>]"
               );
}

Assistant:

void test(const std::vector<KvPair>& kvs, std::unique_ptr<T> dic) {
  for (auto &kv : kvs) {
    assert(dic->insert_key(kv.key.c_str(), kv.value));
  }
  for (auto &kv : kvs) {
    assert(dic->search_key(kv.key.c_str()) == kv.value);
  }
  {
    Stat stat{};
    dic->stat(stat);
    assert(stat.num_keys == kvs.size());
  }
  {
    std::vector<KvPair> ret;
    dic->enumerate(ret);
    assert(kvs.size() == ret.size());
  }

  std::vector<const KvPair*> test_kvs[2];
  for (size_t i = 0; i < kvs.size(); ++i) {
    test_kvs[i % 2].push_back(&kvs[i]);
  }

  for (auto kv : test_kvs[0]) {
    assert(dic->delete_key(kv->key.c_str()) == kv->value);
  }
  for (auto kv : test_kvs[0]) {
    assert(dic->search_key(kv->key.c_str()) == NOT_FOUND);
  }
  for (auto kv : test_kvs[1]) {
    assert(dic->search_key(kv->key.c_str()) == kv->value);
  }

  const char* file_name = "test.index";
  {
    std::ofstream ofs{file_name};
    dic->write(ofs);
  }

  {
    std::ifstream ifs{file_name};
    auto size = static_cast<size_t>(ifs.seekg(0, std::ios::end).tellg());
    Stat stat{};
    dic->stat(stat);
    assert(stat.size_in_bytes == size);
  }

  {
    std::ifstream ifs{file_name};
    dic = make_unique<T>(ifs);
  }

  dic->pack();

  for (auto kv : test_kvs[0]) {
    assert(dic->search_key(kv->key.c_str()) == NOT_FOUND);
  }
  for (auto kv : test_kvs[1]) {
    assert(dic->search_key(kv->key.c_str()) == kv->value);
  }
  {
    Stat stat{};
    dic->stat(stat);
    assert(stat.num_keys == test_kvs[1].size());
  }

  {
    std::ifstream ifs{file_name};
    dic = make_unique<T>(ifs);
  }

  dic->rebuild();

  for (auto kv : test_kvs[0]) {
    assert(dic->search_key(kv->key.c_str()) == NOT_FOUND);
  }
  for (auto kv : test_kvs[1]) {
    assert(dic->search_key(kv->key.c_str()) == kv->value);
  }
  {
    Stat stat{};
    dic->stat(stat);
    assert(stat.num_keys == test_kvs[1].size());
  }
}